

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::InitializeProgressMarks(cmGlobalUnixMakefileGenerator3 *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmLocalGenerator *this_01;
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  *this_02;
  TargetDependSet *pTVar3;
  _Rb_tree_node_base *p_Var4;
  pointer ppcVar5;
  cmGeneratorTarget *gt;
  Snapshot csnp;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  Snapshot tsnp;
  cmGeneratorTarget *local_c0;
  undefined1 local_b8 [40];
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_90;
  pointer local_78;
  cmLocalGenerator *local_70;
  map<cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmState::Snapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *local_68;
  Snapshot local_60;
  Snapshot local_48;
  
  local_68 = &this->DirectoryTargetsMap;
  std::
  _Rb_tree<cmState::Snapshot,_std::pair<const_cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_cmState::Snapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::clear(&local_68->_M_t);
  local_78 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_78 !=
      (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_70 = *local_78;
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_90,&local_70->GeneratorTargets);
      ppcVar5 = local_90.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_90.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_90.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          local_c0 = *ppcVar5;
          this_01 = cmGeneratorTarget::GetLocalGenerator(local_c0);
          TVar2 = cmGeneratorTarget::GetType(local_c0);
          this_00 = local_c0;
          if (TVar2 != INTERFACE_LIBRARY) {
            local_b8._0_8_ = local_b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,"EXCLUDE_FROM_ALL","");
            bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,(string *)local_b8);
            if ((cmState *)local_b8._0_8_ != (cmState *)(local_b8 + 0x10)) {
              operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
            }
            if (!bVar1) {
              cmLocalGenerator::GetStateSnapshot((Snapshot *)local_b8,local_70);
              cmLocalGenerator::GetStateSnapshot(&local_48,this_01);
              while( true ) {
                bVar1 = cmState::Snapshot::IsValid((Snapshot *)local_b8);
                if ((!bVar1) ||
                   (bVar1 = cmGlobalGenerator::IsExcluded
                                      ((cmGlobalGenerator *)this,(Snapshot *)local_b8,&local_48),
                   bVar1)) break;
                this_02 = (_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                           *)std::
                             map<cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmState::Snapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                             ::operator[](local_68,(Snapshot *)local_b8);
                std::
                _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                ::_M_insert_unique<cmGeneratorTarget_const*const&>(this_02,&local_c0);
                pTVar3 = cmGlobalGenerator::GetTargetDirectDepends
                                   ((cmGlobalGenerator *)this,local_c0);
                for (p_Var4 = (pTVar3->
                              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                              )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var4 !=
                    &(pTVar3->
                     super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                     )._M_t._M_impl.super__Rb_tree_header;
                    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
                  local_60.State = *(cmState **)(p_Var4 + 1);
                  std::
                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  ::_M_insert_unique<cmGeneratorTarget_const*>
                            (this_02,(cmGeneratorTarget **)&local_60);
                }
                cmState::Snapshot::GetBuildsystemDirectoryParent(&local_60,(Snapshot *)local_b8);
                local_b8._16_8_ = local_60.Position.Position;
                local_b8._0_8_ = local_60.State;
              }
            }
          }
          ppcVar5 = ppcVar5 + 1;
        } while (ppcVar5 !=
                 local_90.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_90.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_78 = local_78 + 1;
    } while (local_78 !=
             (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::InitializeProgressMarks()
{
  this->DirectoryTargetsMap.clear();
  // Loop over all targets in all local generators.
  for(std::vector<cmLocalGenerator*>::const_iterator
        lgi = this->LocalGenerators.begin();
      lgi != this->LocalGenerators.end(); ++lgi)
    {
    cmLocalGenerator* lg = *lgi;
    std::vector<cmGeneratorTarget*> targets = lg->GetGeneratorTargets();
    for(std::vector<cmGeneratorTarget*>::const_iterator t = targets.begin();
        t != targets.end(); ++t)
      {
      cmGeneratorTarget* gt = *t;

      cmLocalGenerator* tlg = gt->GetLocalGenerator();

      if(gt->GetType() == cmState::INTERFACE_LIBRARY
          || gt->GetPropertyAsBool("EXCLUDE_FROM_ALL"))
        {
        continue;
        }

      cmState::Snapshot csnp = lg->GetStateSnapshot();
      cmState::Snapshot tsnp = tlg->GetStateSnapshot();

      // Consider the directory containing the target and all its
      // parents until something excludes the target.
      for( ; csnp.IsValid() && !this->IsExcluded(csnp, tsnp);
          csnp = csnp.GetBuildsystemDirectoryParent())
        {
        // This local generator includes the target.
        std::set<cmGeneratorTarget const*>& targetSet =
          this->DirectoryTargetsMap[csnp];
        targetSet.insert(gt);

        // Add dependencies of the included target.  An excluded
        // target may still be included if it is a dependency of a
        // non-excluded target.
        TargetDependSet const& tgtdeps = this->GetTargetDirectDepends(gt);
        for(TargetDependSet::const_iterator ti = tgtdeps.begin();
            ti != tgtdeps.end(); ++ti)
          {
          targetSet.insert(*ti);
          }
        }
      }
    }
}